

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<char> * __thiscall
VW::config::typed_option<char>::value(typed_option<char> *this,char value)

{
  __shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<char,char&>((char *)&local_20);
  std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }